

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

pair<EigenAnswer,_double> * task2(pair<EigenAnswer,_double> *__return_storage_ptr__,Matrix *A)

{
  long lVar1;
  long lVar2;
  EigenAnswer ans;
  EigenAnswer local_40;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  PowerIterationMethod(&local_40,A,&it);
  lVar2 = std::chrono::_V2::system_clock::now();
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,&local_40.vector);
  (__return_storage_ptr__->first).value = local_40.value;
  __return_storage_ptr__->second = (double)((lVar2 - lVar1) / 1000000);
  if (local_40.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.vector.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.vector.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<EigenAnswer, double> task2(const Matrix &A)
{
    std::chrono::time_point<std::chrono::high_resolution_clock> start, end;

    start = std::chrono::high_resolution_clock::now();
    auto ans = PowerIterationMethod(A);
    end = std::chrono::high_resolution_clock::now();

    return {ans, std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count()};
}